

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

SorterRecord * vdbeSorterMerge(SortSubtask *pTask,SorterRecord *p1,SorterRecord *p2)

{
  int iVar1;
  SorterRecord *in_RDX;
  SorterRecord *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int res;
  SorterRecord **pp;
  int bCached;
  SorterRecord *pFinal;
  anon_union_8_2_0134e7e8_for_u *local_38;
  SorterRecord *local_30;
  SorterRecord *local_28;
  undefined4 local_14;
  anon_union_8_2_0134e7e8_for_u local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.pNext = (SorterRecord *)0x0;
  local_38 = &local_10;
  local_14 = 0;
  local_30 = in_RDX;
  local_28 = in_RSI;
  do {
    while (iVar1 = (**(code **)(in_RDI + 0x38))
                             (in_RDI,&local_14,local_28 + 1,local_28->nVal,local_30 + 1,
                              local_30->nVal), 0 < iVar1) {
      local_38->pNext = local_30;
      local_38 = &local_30->u;
      local_30 = (local_30->u).pNext;
      local_14 = 0;
      if (local_30 == (SorterRecord *)0x0) {
        local_38->pNext = local_28;
LAB_001994a6:
        if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
          __stack_chk_fail();
        }
        return local_10.pNext;
      }
    }
    local_38->pNext = local_28;
    local_38 = &local_28->u;
    local_28 = (local_28->u).pNext;
  } while (local_28 != (SorterRecord *)0x0);
  local_38->pNext = local_30;
  goto LAB_001994a6;
}

Assistant:

static SorterRecord *vdbeSorterMerge(
  SortSubtask *pTask,             /* Calling thread context */
  SorterRecord *p1,               /* First list to merge */
  SorterRecord *p2                /* Second list to merge */
){
  SorterRecord *pFinal = 0;
  SorterRecord **pp = &pFinal;
  int bCached = 0;

  assert( p1!=0 && p2!=0 );
  for(;;){
    int res;
    res = pTask->xCompare(
        pTask, &bCached, SRVAL(p1), p1->nVal, SRVAL(p2), p2->nVal
    );

    if( res<=0 ){
      *pp = p1;
      pp = &p1->u.pNext;
      p1 = p1->u.pNext;
      if( p1==0 ){
        *pp = p2;
        break;
      }
    }else{
      *pp = p2;
      pp = &p2->u.pNext;
      p2 = p2->u.pNext;
      bCached = 0;
      if( p2==0 ){
        *pp = p1;
        break;
      }
    }
  }
  return pFinal;
}